

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

void map_destroy(map m)

{
  long lVar1;
  size_t iterator;
  ulong uVar2;
  
  if (m != (map)0x0) {
    if (m->buckets != (bucket)0x0) {
      lVar1 = 0x10;
      for (uVar2 = 0; uVar2 < m->capacity; uVar2 = uVar2 + 1) {
        free(*(void **)((long)&m->buckets->count + lVar1));
        lVar1 = lVar1 + 0x18;
      }
      free(m->buckets);
    }
    free(m);
    return;
  }
  return;
}

Assistant:

void map_destroy(map m)
{
	if (m == NULL)
	{
		return;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	free(m);
}